

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O2

void __thiscall
llbuild::core::TaskInterface::spawn(TaskInterface *this,QueueJob *job,QueueJobPriority priority)

{
  long *plVar1;
  QueueJob local_40;
  
  plVar1 = *(long **)((long)this->impl + 0xb8);
  basic::QueueJob::QueueJob(&local_40,job);
  (**(code **)(*plVar1 + 0x10))(plVar1,&local_40,priority);
  if (local_40.work.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_40.work.super__Function_base._M_manager)
              ((_Any_data *)&local_40.work,(_Any_data *)&local_40.work,__destroy_functor);
  }
  return;
}

Assistant:

void TaskInterface::spawn(basic::QueueJob&& job, basic::QueueJobPriority priority) {
  // FIXME: handle environment
  static_cast<BuildEngineImpl*>(impl)->getExecutionQueue().addJob(std::move(job), priority);
}